

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O1

void __thiscall
pybind11::detail::error_fetch_and_normalize::restore(error_fetch_and_normalize *this)

{
  PyObject *pPVar1;
  long *plVar2;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_28;
  
  if (this->m_restore_called != true) {
    plVar2 = (long *)__tls_get_addr(&PTR_0019ddc0);
    *plVar2 = *plVar2 + 1;
    pPVar1 = (this->m_type).super_handle.m_ptr;
    if (pPVar1 != (PyObject *)0x0) {
      pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
    }
    *plVar2 = *plVar2 + 1;
    pPVar1 = (this->m_value).super_handle.m_ptr;
    if (pPVar1 != (PyObject *)0x0) {
      pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
    }
    *plVar2 = *plVar2 + 1;
    pPVar1 = (this->m_trace).super_handle.m_ptr;
    if (pPVar1 != (PyObject *)0x0) {
      pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
    }
    PyErr_Restore();
    this->m_restore_called = true;
    return;
  }
  __rhs = error_string_abi_cxx11_(this);
  std::operator+(&bStack_28,
                 "Internal error: pybind11::detail::error_fetch_and_normalize::restore() called a second time. ORIGINAL ERROR: "
                 ,__rhs);
  pybind11_fail(&bStack_28);
}

Assistant:

void restore() {
        if (m_restore_called) {
            pybind11_fail("Internal error: pybind11::detail::error_fetch_and_normalize::restore() "
                          "called a second time. ORIGINAL ERROR: "
                          + error_string());
        }
        PyErr_Restore(m_type.inc_ref().ptr(), m_value.inc_ref().ptr(), m_trace.inc_ref().ptr());
        m_restore_called = true;
    }